

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dh.cc
# Opt level: O2

int pkey_dh_ctrl(EVP_PKEY_CTX *ctx,int type,int p1,void *p2)

{
  int iVar1;
  
  iVar1 = 1;
  if (type != 3) {
    if (type == 0x1013) {
      *(int *)ctx->data = p1;
    }
    else {
      iVar1 = 0;
      ERR_put_error(6,0,0x65,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dh.cc"
                    ,0x7f);
    }
  }
  return iVar1;
}

Assistant:

static int pkey_dh_ctrl(EVP_PKEY_CTX *ctx, int type, int p1, void *p2) {
  DH_PKEY_CTX *dctx = reinterpret_cast<DH_PKEY_CTX *>(ctx->data);
  switch (type) {
    case EVP_PKEY_CTRL_PEER_KEY:
      // |EVP_PKEY_derive_set_peer| requires the key implement this command,
      // even if it is a no-op.
      return 1;

    case EVP_PKEY_CTRL_DH_PAD:
      dctx->pad = p1;
      return 1;

    default:
      OPENSSL_PUT_ERROR(EVP, EVP_R_COMMAND_NOT_SUPPORTED);
      return 0;
  }
}